

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O1

string * __thiscall
Omega_h::Read<int>::name_abi_cxx11_(string *__return_storage_ptr__,Read<int> *this)

{
  Alloc *pAVar1;
  pointer pcVar2;
  
  pAVar1 = (this->write_).shared_alloc_.alloc;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pAVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar1->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return write_.name(); }